

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

ZDD zdd_enum_first(ZDD dd,ZDD dom,uint8_t *arr,zdd_enum_filter_cb filter_cb)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  zddnode_t pzVar4;
  ZDD dom_00;
  ZDD ZVar5;
  ZDD res_1;
  ZDD res;
  uint32_t dd_var;
  zddnode_t dd_node;
  ZDD dom_next;
  uint32_t dom_var;
  zddnode_t dom_node;
  zdd_enum_filter_cb filter_cb_local;
  uint8_t *arr_local;
  ZDD dom_local;
  ZDD dd_local;
  
  if (dd == 0) {
    dd_local = 0;
  }
  else {
    iVar1 = zdd_isleaf(dd);
    if (iVar1 == 0) {
      if (dom == 0x8000000000000000) {
        __assert_fail("dom != zdd_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_zdd.c"
                      ,0x6e1,"ZDD zdd_enum_first(ZDD, ZDD, uint8_t *, zdd_enum_filter_cb)");
      }
      pzVar4 = ZDD_GETNODE(dom);
      uVar2 = zddnode_getvariable(pzVar4);
      dom_00 = zddnode_high(dom,pzVar4);
      pzVar4 = ZDD_GETNODE(dd);
      uVar3 = zddnode_getvariable(pzVar4);
      if (uVar2 < uVar3) {
        dd_local = zdd_enum_first(dd,dom_00,arr + 1,filter_cb);
        if (dd_local == 0) {
          dd_local = 0;
        }
        else {
          *arr = '\0';
        }
      }
      else {
        ZVar5 = zddnode_low(dd,pzVar4);
        dd_local = zdd_enum_first(ZVar5,dom_00,arr + 1,filter_cb);
        if (dd_local == 0) {
          ZVar5 = zddnode_high(dd,pzVar4);
          dd_local = zdd_enum_first(ZVar5,dom_00,arr + 1,filter_cb);
          if (dd_local == 0) {
            dd_local = 0;
          }
          else {
            *arr = '\x01';
          }
        }
        else {
          *arr = '\0';
        }
      }
    }
    else {
      filter_cb_local = (zdd_enum_filter_cb)arr;
      arr_local = (uint8_t *)dom;
      if ((filter_cb == (zdd_enum_filter_cb)0x0) || (iVar1 = (*filter_cb)(dd), iVar1 != 0)) {
        while (dd_local = dd, arr_local != (uint8_t *)0x8000000000000000) {
          *filter_cb_local = (_func_int_ZDD)0x0;
          arr_local = (uint8_t *)zdd_gethigh((ZDD)arr_local);
          filter_cb_local = filter_cb_local + 1;
        }
      }
      else {
        dd_local = 0;
      }
    }
  }
  return dd_local;
}

Assistant:

ZDD zdd_enum_first(ZDD dd, ZDD dom, uint8_t *arr, zdd_enum_filter_cb filter_cb)
{
    if (dd == zdd_false) {
        return zdd_false;
    } else if (zdd_isleaf(dd)) {
        if (filter_cb != NULL && filter_cb(dd) == 0) return zdd_false;
        while (dom != zdd_true) {
            *arr++ = 0;
            dom = zdd_gethigh(dom);
        }
        return dd;
    } else {
        assert(dom != zdd_true);

        /**
         * Obtain domain variable
         */
        const zddnode_t dom_node = ZDD_GETNODE(dom);
        const uint32_t dom_var = zddnode_getvariable(dom_node);
        const ZDD dom_next = zddnode_high(dom, dom_node);
        const zddnode_t dd_node = ZDD_GETNODE(dd);
        const uint32_t dd_var = zddnode_getvariable(dd_node);

        if (dom_var < dd_var) {
            // try low only (high == zdd_false)
            ZDD res = zdd_enum_first(dd, dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 0;
                return res;
            } else {
                return zdd_false;
            }
        } else {
            /**
             * Try low first, else high, else return False
             */
            ZDD res = zdd_enum_first(zddnode_low(dd, dd_node), dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 0;
                return res;
            }

            res = zdd_enum_first(zddnode_high(dd, dd_node), dom_next, arr+1, filter_cb);
            if (res != zdd_false) {
                *arr = 1;
                return res;
            } else {
                return zdd_false;
            }
        }
    }
}